

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fft_reaper.cc
# Opt level: O0

void __thiscall sptk::reaper::FFT::fft(FFT *this,float *x,float *y)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int l;
  int jm;
  int im;
  int k;
  int nv2;
  int j;
  int lm;
  int lixnp;
  int lo;
  int lmx;
  int i;
  int lix;
  int li;
  int j2;
  int j1;
  float t2;
  float t1;
  float s;
  float c;
  float *y_local;
  float *x_local;
  FFT *this_local;
  
  k = this->kbase;
  iVar7 = this->power2;
  lmx = this->fftSize;
  for (lo = 0; lo < iVar7; lo = lo + 1) {
    iVar9 = lmx / 2;
    iVar8 = this->fftSize;
    i = 0;
    for (lm = 0; lm < iVar9; lm = lm + 1) {
      fVar1 = this->fcosine[i];
      fVar2 = this->fsine[i];
      j2 = lm + iVar9;
      for (j1 = lm; j1 <= (iVar8 - lmx) + lm; j1 = lmx + j1) {
        fVar3 = x[j1];
        fVar4 = x[j2];
        fVar5 = y[j1];
        fVar6 = y[j2];
        x[j1] = x[j2] + x[j1];
        y[j1] = y[j2] + y[j1];
        x[j2] = fVar1 * (fVar3 - fVar4) + fVar2 * (fVar5 - fVar6);
        y[j2] = fVar1 * (fVar5 - fVar6) + -(fVar2 * (fVar3 - fVar4));
        j2 = lmx + j2;
      }
      i = k + i;
    }
    k = k << 1;
    lmx = iVar9;
  }
  j = 1;
  iVar7 = this->fftSize;
  for (i = 1; i < this->fftSize; i = i + 1) {
    k = iVar7;
    if (j < i) {
      iVar8 = j + -1;
      iVar9 = i + -1;
      fVar1 = x[iVar8];
      fVar2 = y[iVar8];
      x[iVar8] = x[iVar9];
      y[iVar8] = y[iVar9];
      x[iVar9] = fVar1;
      y[iVar9] = fVar2;
    }
    while (k = k / 2, k < j) {
      j = j - k;
    }
    j = k + j;
  }
  return;
}

Assistant:

void FFT::fft(float *x, float *y) {
  float c, s,  t1, t2;
  int j1, j2, li, lix, i;
  int lmx, lo, lixnp, lm, j, nv2, k = kbase, im, jm, l = power2;

  for (lmx = fftSize, lo = 0; lo < l; lo++, k *= 2) {
    lix = lmx;
    lmx /= 2;
    lixnp = fftSize - lix;
    for (i = 0, lm = 0; lm < lmx; lm++, i += k) {
      c = fcosine[i];
      s = fsine[i];
      for (li = lixnp + lm, j1 = lm, j2 = lm + lmx; j1 <= li;
            j1 += lix, j2 += lix) {
        t1 = x[j1] - x[j2];
        t2 = y[j1] - y[j2];
        x[j1] += x[j2];
        y[j1] += y[j2];
        x[j2] = (c * t1) + (s * t2);
        y[j2] = (c * t2) - (s * t1);
      }
    }
  }

  /* Now perform the bit reversal. */
  j = 1;
  nv2 = fftSize / 2;
  for (i = 1; i < fftSize; i++) {
    if (j < i) {
      jm = j - 1;
      im = i - 1;
      t1 = x[jm];
      t2 = y[jm];
      x[jm] = x[im];
      y[jm] = y[im];
      x[im] = t1;
      y[im] = t2;
    }
    k = nv2;
    while (j > k) {
      j -= k;
      k /= 2;
    }
    j += k;
  }
}